

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_Type.cxx
# Opt level: O1

Fl_Type * __thiscall
Fl_Input_Choice_Type::click_test(Fl_Input_Choice_Type *this,int param_1,int param_2)

{
  Fl_Menu_ *this_00;
  Fl_Menu_Item *m;
  Fl_Menu_Item *pFVar1;
  
  if (((this->super_Fl_Menu_Type).super_Fl_Widget_Type.super_Fl_Type.selected == '\0') &&
     ((this->super_Fl_Menu_Type).menusize != 0)) {
    this_00 = (Fl_Menu_ *)(this->super_Fl_Menu_Type).super_Fl_Widget_Type.o[1].label_.value;
    m = this_00->value_;
    Fl_Menu_::value(this_00,(Fl_Menu_Item *)0x0);
    Fl::pushed((Fl_Widget *)this_00);
    (*(this_00->super_Fl_Widget)._vptr_Fl_Widget[3])(this_00,1);
    pFVar1 = this_00->value_;
    if (pFVar1 == (Fl_Menu_Item *)0x0) {
      Fl_Menu_::value(this_00,m);
    }
    else {
      if ((pFVar1->flags & 10) != 0) {
        (*(this->super_Fl_Menu_Type).super_Fl_Widget_Type.super_Fl_Type._vptr_Fl_Type[0x2f])(this);
      }
      this = (Fl_Input_Choice_Type *)pFVar1->user_data_;
    }
  }
  else {
    this = (Fl_Input_Choice_Type *)0x0;
  }
  return (Fl_Type *)this;
}

Assistant:

Fl_Type* Fl_Input_Choice_Type::click_test(int, int) {
  if (selected) return 0; // let user move the widget
  Fl_Menu_* w = ((Fl_Input_Choice*)o)->menubutton();
  if (!menusize) return 0;
  const Fl_Menu_Item* save = w->mvalue();
  w->value((Fl_Menu_Item*)0);
  Fl::pushed(w);
  w->handle(FL_PUSH);
  const Fl_Menu_Item* m = w->mvalue();
  if (m) {
    // restore the settings of toggles & radio items:
    if (m->flags & (FL_MENU_RADIO | FL_MENU_TOGGLE)) build_menu();
    return (Fl_Type*)(m->user_data());
  }
  w->value(save);
  return this;
}